

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O0

agentfwd * agentfwd_new(ConnectionLayer *cl,char **socketname_out)

{
  Socket *pSVar1;
  ConnectionLayer *local_40;
  char *socketname;
  char *error;
  char *dir_prefix;
  agentfwd *agent;
  char **socketname_out_local;
  ConnectionLayer *cl_local;
  
  agent = (agentfwd *)socketname_out;
  socketname_out_local = (char **)cl;
  dir_prefix = (char *)safemalloc(1,0x18,0);
  *(char ***)dir_prefix = socketname_out_local;
  *(PlugVtable **)(dir_prefix + 0x10) = &agentfwd_plugvt;
  error = dupprintf("/tmp/%s-agentfwd","Uppity");
  socketname = (char *)0x0;
  local_40 = (ConnectionLayer *)0x0;
  pSVar1 = platform_make_agent_socket
                     ((Plug *)(dir_prefix + 0x10),error,&socketname,(char **)&local_40);
  *(Socket **)(dir_prefix + 8) = pSVar1;
  safefree(error);
  safefree(socketname);
  if (*(long *)(dir_prefix + 8) == 0) {
    safefree(dir_prefix);
    safefree(local_40);
    cl_local = (ConnectionLayer *)0x0;
  }
  else {
    agent->cl = local_40;
    cl_local = (ConnectionLayer *)dir_prefix;
  }
  return (agentfwd *)cl_local;
}

Assistant:

agentfwd *agentfwd_new(ConnectionLayer *cl, char **socketname_out)
{
    agentfwd *agent = snew(agentfwd);
    agent->cl = cl;
    agent->plug.vt = &agentfwd_plugvt;

    char *dir_prefix = dupprintf("/tmp/%s-agentfwd", appname);
    char *error = NULL, *socketname = NULL;
    agent->socket = platform_make_agent_socket(
        &agent->plug, dir_prefix, &error, &socketname);
    sfree(dir_prefix);
    sfree(error);

    if (!agent->socket) {
        sfree(agent);
        sfree(socketname);
        return NULL;
    }

    *socketname_out = socketname;
    return agent;
}